

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_newton.c
# Opt level: O2

int check_retval(void *flagvalue,char *funcname,int opt)

{
  if (opt == 0) {
    if (flagvalue != (void *)0x0) {
      return 0;
    }
    fprintf(_stderr,"\nERROR: %s() failed -- returned NULL\n\n",funcname);
  }
  else {
    if (*flagvalue == 0) {
      return 0;
    }
    fprintf(_stderr,"\nERROR: %s() failed -- returned %d\n\n",funcname);
  }
  return 1;
}

Assistant:

static int check_retval(void *flagvalue, const char *funcname, int opt)
{
  int *errflag;

  /* Check if the function returned a NULL pointer -- no memory allocated */
  if (opt == 0) {
    if (flagvalue == NULL) {
      fprintf(stderr, "\nERROR: %s() failed -- returned NULL\n\n", funcname);
      return(1);
    } else {
      return(0);
    }
  }

  /* Check if the function returned an non-zero value -- internal failure */
  if (opt == 1) {
    errflag = (int *) flagvalue;
    if (*errflag != 0) {
      fprintf(stderr, "\nERROR: %s() failed -- returned %d\n\n", funcname, *errflag);
      return(1);
    } else {
      return(0);
    }
  }

  /* if we make it here then opt was not 0 or 1 */
  fprintf(stderr, "\nERROR: check_retval failed -- Invalid opt value\n\n");
  return(1);
}